

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

int write_file_descriptors(archive_write *a)

{
  undefined2 uVar1;
  undefined4 uVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 uVar10;
  int iVar11;
  long lVar12;
  int64_t offset;
  iso9660_conflict *iso9660;
  long lVar13;
  int64_t *piVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  undefined1 auVar23 [16];
  
  pvVar3 = a->format_data;
  if (*(long *)((long)pvVar3 + 0x10320) != 0) {
    lVar13 = *(long *)((long)pvVar3 + 0x102e0);
    memset((void *)((long)pvVar3 + (0x102dc - lVar13)),0,0x800);
    *(undefined1 *)((long)pvVar3 + (0x102dc - lVar13)) = 1;
    *(undefined1 *)((long)pvVar3 + (0x102dd - lVar13)) = *(undefined1 *)((long)pvVar3 + 0x10348);
    *(undefined2 *)((long)pvVar3 + (0x102de - lVar13)) = 0;
    if (*(long *)((long)pvVar3 + 0x10358) != 0) {
      strncpy((char *)((long)pvVar3 + (0x102e0 - lVar13)),*(char **)((long)pvVar3 + 0x10350),0x17);
    }
    *(undefined4 *)((long)pvVar3 + (0x102f7 - lVar13)) = 0x55000000;
    *(undefined1 *)((long)pvVar3 + (0x102fb - lVar13)) = 0xaa;
    sVar15 = 0;
    sVar16 = 0;
    sVar17 = 0;
    sVar18 = 0;
    sVar19 = 0;
    sVar20 = 0;
    sVar21 = 0;
    sVar22 = 0;
    lVar12 = 0;
    do {
      auVar23._8_8_ =
           (ulong)*(byte *)((long)pvVar3 + lVar12 * 2 + (0x102e4 - lVar13)) |
           (ulong)*(byte *)((long)pvVar3 + lVar12 * 2 + (0x102e6 - lVar13)) << 0x10 |
           (ulong)*(byte *)((long)pvVar3 + lVar12 * 2 + (0x102e8 - lVar13)) << 0x20 |
           (ulong)*(byte *)((long)pvVar3 + lVar12 * 2 + (0x102ea - lVar13)) << 0x30;
      auVar23._0_8_ =
           (ulong)CONCAT14(*(undefined1 *)((long)pvVar3 + lVar12 * 2 + (0x102e0 - lVar13)),
                           (uint)*(byte *)((long)pvVar3 + lVar12 * 2 + (0x102de - lVar13)) << 0x10 |
                           (uint)*(byte *)((long)pvVar3 + lVar12 * 2 + (0x102dc - lVar13))) |
           (ulong)*(byte *)((long)pvVar3 + lVar12 * 2 + (0x102e2 - lVar13)) << 0x30;
      auVar7[10] = 0;
      auVar7._0_10_ = SUB1610((undefined1  [16])0x0,0);
      auVar7[0xb] = *(undefined1 *)((long)pvVar3 + lVar12 * 2 + (0x102e7 - lVar13));
      auVar8[9] = *(undefined1 *)((long)pvVar3 + lVar12 * 2 + (0x102e5 - lVar13));
      auVar8._0_9_ = SUB169((undefined1  [16])0x0,0);
      auVar8._10_2_ = auVar7._10_2_;
      auVar9._9_3_ = auVar8._9_3_;
      auVar9._0_9_ = (unkuint9)0;
      auVar6._1_10_ =
           SUB1610(ZEXT516(CONCAT41(auVar9._8_4_,
                                    *(undefined1 *)((long)pvVar3 + lVar12 * 2 + (0x102e3 - lVar13)))
                          ) << 0x38,6);
      auVar6[0] = *(undefined1 *)((long)pvVar3 + lVar12 * 2 + (0x102e1 - lVar13));
      auVar6._11_5_ = 0;
      auVar5._1_12_ = SUB1612(auVar6 << 0x28,4);
      auVar5[0] = *(undefined1 *)((long)pvVar3 + lVar12 * 2 + (0x102df - lVar13));
      auVar5._13_3_ = 0;
      auVar4._1_14_ = SUB1614(auVar5 << 0x18,2);
      auVar4[0] = *(undefined1 *)((long)pvVar3 + lVar12 * 2 + (0x102dd - lVar13));
      auVar4[0xf] = 0;
      auVar23 = auVar4 << 8 | auVar23;
      sVar15 = sVar15 + auVar23._0_2_;
      sVar16 = sVar16 + auVar23._2_2_;
      sVar17 = sVar17 + auVar23._4_2_;
      sVar18 = sVar18 + auVar23._6_2_;
      sVar19 = sVar19 + auVar23._8_2_;
      sVar20 = sVar20 + auVar23._10_2_;
      sVar21 = sVar21 + auVar23._12_2_;
      sVar22 = sVar22 + auVar23._14_2_;
      lVar12 = lVar12 + 8;
    } while (lVar12 != 0x10);
    sVar16 = sVar22 + sVar18 + sVar20 + sVar16;
    iVar11 = -CONCAT22(sVar16,sVar16 + sVar21 + sVar17 + sVar19 + sVar15);
    *(char *)((long)pvVar3 + (0x102f8 - lVar13)) = (char)iVar11;
    *(char *)((long)pvVar3 + (0x102f9 - lVar13)) = (char)((uint)iVar11 >> 8);
    *(undefined1 *)((long)pvVar3 + (0x102fc - lVar13)) = 0x88;
    *(undefined1 *)((long)pvVar3 + (0x102fd - lVar13)) = *(undefined1 *)((long)pvVar3 + 0x10368);
    if (*(char *)((long)pvVar3 + 0x10368) == '\0') {
      uVar1 = *(undefined2 *)((long)pvVar3 + 0x1036a);
      *(char *)((long)pvVar3 + (0x102fe - lVar13)) = (char)uVar1;
      uVar10 = (undefined1)((ushort)uVar1 >> 8);
    }
    else {
      *(undefined1 *)((long)pvVar3 + (0x102fe - lVar13)) = 0;
      uVar10 = 0;
    }
    *(undefined1 *)((long)pvVar3 + (0x102ff - lVar13)) = uVar10;
    *(undefined1 *)((long)pvVar3 + (0x10300 - lVar13)) = *(undefined1 *)((long)pvVar3 + 0x10369);
    *(undefined1 *)((long)pvVar3 + (0x10301 - lVar13)) = 0;
    if (*(char *)((long)pvVar3 + 0x10368) == '\0') {
      uVar1 = *(undefined2 *)((long)pvVar3 + 0x1036c);
      *(char *)((long)pvVar3 + (0x10302 - lVar13)) = (char)uVar1;
      uVar10 = (undefined1)((ushort)uVar1 >> 8);
    }
    else {
      *(undefined1 *)((long)pvVar3 + (0x10302 - lVar13)) = 1;
      uVar10 = 0;
    }
    *(undefined1 *)((long)pvVar3 + (0x10303 - lVar13)) = uVar10;
    uVar2 = *(undefined4 *)(*(long *)(*(long *)((long)pvVar3 + 0x10340) + 0x18) + 0xa4);
    *(char *)((long)pvVar3 + (0x10304 - lVar13)) = (char)uVar2;
    *(char *)((long)pvVar3 + (0x10305 - lVar13)) = (char)((uint)uVar2 >> 8);
    *(char *)((long)pvVar3 + (0x10306 - lVar13)) = (char)((uint)uVar2 >> 0x10);
    *(char *)((long)pvVar3 + (0x10307 - lVar13)) = (char)((uint)uVar2 >> 0x18);
    *(undefined1 (*) [16])((long)pvVar3 + (0x10308 - lVar13)) = (undefined1  [16])0x0;
    *(undefined4 *)((long)pvVar3 + (0x10318 - lVar13)) = 0;
    iVar11 = wb_consume(a,0x800);
    if (iVar11 < 0) {
      return iVar11;
    }
  }
  if (*(long *)((long)pvVar3 + 0x10340) != 0) {
    lVar13 = *(long *)(*(long *)((long)pvVar3 + 0x10340) + 0x18);
    lVar12 = (long)*(int *)(lVar13 + 0xa0);
    lVar13 = *(long *)(lVar13 + 0x90);
    if (lVar13 == 0) goto LAB_00149448;
    iVar11 = write_file_contents(a,lVar13,lVar12 << 0xb);
    if (iVar11 < 0) {
      return iVar11;
    }
  }
  lVar12 = 0;
LAB_00149448:
  offset = 0;
  for (lVar13 = *(long *)((long)pvVar3 + 0x98); lVar13 != 0; lVar13 = *(long *)(lVar13 + 8)) {
    if (*(int *)(lVar13 + 0xb8) != 0) {
      piVar14 = (int64_t *)(lVar13 + 0x90);
      if (offset + lVar12 * 0x800 < *(long *)(lVar13 + 0x90)) {
        if ((0 < lVar12) && (iVar11 = write_file_contents(a,offset,lVar12 * 0x800), iVar11 < 0)) {
          return iVar11;
        }
        offset = *piVar14;
        lVar12 = 0;
      }
      *(int64_t **)(lVar13 + 0xb0) = piVar14;
      do {
        lVar12 = lVar12 + (int)piVar14[2];
        piVar14 = (int64_t *)piVar14[3];
      } while (piVar14 != (int64_t *)0x0);
      *(undefined8 *)(lVar13 + 0xb0) = 0;
    }
  }
  if ((0 < lVar12) && (iVar11 = write_file_contents(a,offset,lVar12 << 0xb), iVar11 < 0)) {
    return iVar11;
  }
  return 0;
}

Assistant:

static int
write_file_descriptors(struct archive_write *a)
{
	struct iso9660 *iso9660 = a->format_data;
	struct isofile *file;
	int64_t blocks, offset;
	int r;

	blocks = 0;
	offset = 0;

	/* Make the boot catalog contents, and write it. */
	if (iso9660->el_torito.catalog != NULL) {
		r = make_boot_catalog(a);
		if (r < 0)
			return (r);
	}

	/* Write the boot file contents. */
	if (iso9660->el_torito.boot != NULL) {
		file = iso9660->el_torito.boot->file;
		blocks = file->content.blocks;
		offset = file->content.offset_of_temp;
		if (offset != 0) {
			r = write_file_contents(a, offset,
			    blocks << LOGICAL_BLOCK_BITS);
			if (r < 0)
				return (r);
			blocks = 0;
			offset = 0;
		}
	}

	/* Write out all file contents. */
	for (file = iso9660->data_file_list.first;
	    file != NULL; file = file->datanext) {

		if (!file->write_content)
			continue;

		if ((offset + (blocks << LOGICAL_BLOCK_BITS)) <
		     file->content.offset_of_temp) {
			if (blocks > 0) {
				r = write_file_contents(a, offset,
				    blocks << LOGICAL_BLOCK_BITS);
				if (r < 0)
					return (r);
			}
			blocks = 0;
			offset = file->content.offset_of_temp;
		}

		file->cur_content = &(file->content);
		do {
			blocks += file->cur_content->blocks;
			/* Next fragument */
			file->cur_content = file->cur_content->next;
		} while (file->cur_content != NULL);
	}

	/* Flush out remaining blocks. */
	if (blocks > 0) {
		r = write_file_contents(a, offset,
		    blocks << LOGICAL_BLOCK_BITS);
		if (r < 0)
			return (r);
	}

	return (ARCHIVE_OK);
}